

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

bool google::protobuf::compiler::java::anon_unknown_0::MessageHasConflictingClassName
               (Descriptor *message,string *classname)

{
  undefined8 *puVar1;
  __type _Var2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  _Var2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           message,classname);
  if (_Var2) {
    return true;
  }
  lVar6 = -1;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + 1;
    if (*(int *)(message + 0x48) <= lVar6) {
      lVar6 = -1;
      lVar5 = 0;
      do {
        lVar4 = (long)*(int *)(message + 0x58);
        lVar6 = lVar6 + 1;
        if (lVar4 <= lVar6) {
          return lVar6 < lVar4;
        }
        puVar1 = (undefined8 *)(*(long *)(message + 0x60) + lVar5);
        lVar5 = lVar5 + 0x38;
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )*puVar1,classname);
      } while (!_Var2);
      return lVar6 < lVar4;
    }
    bVar3 = MessageHasConflictingClassName
                      ((Descriptor *)(lVar5 + *(long *)(message + 0x50)),classname);
    lVar5 = lVar5 + 0xa8;
  } while (!bVar3);
  return true;
}

Assistant:

bool MessageHasConflictingClassName(const Descriptor* message,
                                    const string& classname) {
  if (message->name() == classname) return true;
  for (int i = 0; i < message->nested_type_count(); ++i) {
    if (MessageHasConflictingClassName(message->nested_type(i), classname)) {
      return true;
    }
  }
  for (int i = 0; i < message->enum_type_count(); ++i) {
    if (message->enum_type(i)->name() == classname) {
      return true;
    }
  }
  return false;
}